

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::BindTargetListSyntax::BindTargetListSyntax
          (BindTargetListSyntax *this,Token colon,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *targets)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = colon._0_8_;
  (this->super_SyntaxNode).kind = BindTargetList;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->colon).kind = (short)uVar5;
  (this->colon).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->colon).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->colon).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->colon).info = colon.info;
  uVar3 = *(undefined4 *)&(targets->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (targets->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->targets).super_SyntaxListBase.super_SyntaxNode.kind =
       (targets->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->targets).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->targets).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->targets).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (targets->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->targets).super_SyntaxListBase.childCount = (targets->super_SyntaxListBase).childCount;
  (this->targets).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f79a0;
  sVar2 = (targets->elements)._M_extent._M_extent_value;
  (this->targets).elements._M_ptr = (targets->elements)._M_ptr;
  (this->targets).elements._M_extent._M_extent_value = sVar2;
  (this->targets).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar6 = (this->targets).elements._M_extent._M_extent_value + 1;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar7 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->targets).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar4)->parent = &this->super_SyntaxNode;
      lVar7 = lVar7 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

struct SLANG_EXPORT ArgumentSyntax : public SyntaxNode {

    ArgumentSyntax(SyntaxKind kind) :
        SyntaxNode(kind) {
    }

    explicit ArgumentSyntax(const ArgumentSyntax&) = default;

    static bool isKind(SyntaxKind kind);
}